

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O3

void __thiscall SqlGenerator::generateLoadQuery(SqlGenerator *this)

{
  pointer pcVar1;
  bool bVar2;
  char cVar3;
  size_t sVar4;
  TDNode *__rhs;
  long *plVar5;
  Attribute *pAVar6;
  undefined1 *puVar7;
  undefined8 uVar8;
  undefined8 *puVar9;
  long *plVar10;
  ulong *puVar11;
  size_type *psVar12;
  ulong uVar13;
  char *__end;
  ulong uVar14;
  char cVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  string drop_views;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string drop;
  string __str_2;
  string load;
  ofstream ofs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  long *local_300;
  long local_2f8;
  undefined8 local_2f0;
  long lStack_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  SqlGenerator *local_2c0;
  long *local_2b8;
  long local_2b0;
  long local_2a8;
  long lStack_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  long *local_278;
  long local_270;
  long local_268;
  long lStack_260;
  ulong local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  ios_base local_138 [264];
  
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  local_2c0 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"","");
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"","");
  uVar14 = 0;
  while( true ) {
    paVar16 = &local_340.field_2;
    sVar4 = TreeDecomposition::numberOfRelations
                      ((local_2c0->_td).
                       super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (sVar4 <= uVar14) break;
    __rhs = TreeDecomposition::getRelation
                      ((local_2c0->_td).
                       super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       uVar14);
    std::operator+(&local_340,"DROP TABLE IF EXISTS ",&__rhs->_name);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_340);
    plVar10 = plVar5 + 2;
    if ((long *)*plVar5 == plVar10) {
      local_220 = *plVar10;
      lStack_218 = plVar5[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *plVar10;
      local_230 = (long *)*plVar5;
    }
    local_228 = plVar5[1];
    *plVar5 = (long)plVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != paVar16) {
      operator_delete(local_340._M_dataplus._M_p);
    }
    std::operator+(&local_340,"CREATE TABLE ",&__rhs->_name);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_340);
    plVar10 = plVar5 + 2;
    if ((long *)*plVar5 == plVar10) {
      local_220 = *plVar10;
      lStack_218 = plVar5[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *plVar10;
      local_230 = (long *)*plVar5;
    }
    local_228 = plVar5[1];
    *plVar5 = (long)plVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_298,(ulong)local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230);
    }
    local_258 = uVar14;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != paVar16) {
      operator_delete(local_340._M_dataplus._M_p);
    }
    uVar14 = 0;
    do {
      if (((__rhs->_bag).super__Base_bitset<2UL>._M_w[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0) {
        pAVar6 = TreeDecomposition::getAttribute
                           ((local_2c0->_td).
                            super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            ,uVar14);
        local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
        pcVar1 = (pAVar6->_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_320,pcVar1,pcVar1 + (pAVar6->_name)._M_string_length);
        std::__cxx11::string::append((char *)&local_320);
        switch(pAVar6->_type) {
        case Integer:
        case Short:
        case U_Integer:
          local_2f0 = CONCAT53(local_2f0._3_5_,0x740000);
          local_2f0 = CONCAT62(local_2f0._2_6_,0x6e69);
          local_2f8 = 3;
          puVar7 = (undefined1 *)((long)&local_2f0 + 3);
          break;
        case Double:
          local_2f0 = CONCAT17(local_2f0._7_1_,0x63697265000000);
          local_2f0 = CONCAT44(local_2f0._4_4_,0x656d756e);
          local_2f8 = 7;
          puVar7 = (undefined1 *)((long)&local_2f0 + 7);
          break;
        default:
          std::operator<<((ostream *)&std::cerr,
                          "This type does not exist  (SqlGenerator - typeToString)\n");
          exit(1);
        }
        local_300 = &local_2f0;
        *puVar7 = 0;
        uVar8 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          uVar8 = local_320.field_2._M_allocated_capacity;
        }
        if (local_2f8 + local_320._M_string_length < 0x10 &&
            (ulong)uVar8 < local_2f8 + local_320._M_string_length) {
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_300,0,(char *)0x0,(ulong)local_320._M_dataplus._M_p);
        }
        else {
          puVar9 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_320,(ulong)&local_2f0);
        }
        psVar12 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_340.field_2._M_allocated_capacity = *psVar12;
          local_340.field_2._8_8_ = puVar9[3];
          local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
        }
        else {
          local_340.field_2._M_allocated_capacity = *psVar12;
          local_340._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_340._M_string_length = puVar9[1];
        *puVar9 = psVar12;
        puVar9[1] = 0;
        *(undefined1 *)psVar12 = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_340);
        plVar5 = puVar9 + 2;
        if ((long *)*puVar9 == plVar5) {
          local_220 = *plVar5;
          lStack_218 = puVar9[3];
          local_230 = &local_220;
        }
        else {
          local_220 = *plVar5;
          local_230 = (long *)*puVar9;
        }
        local_228 = puVar9[1];
        *puVar9 = plVar5;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_298,(ulong)local_230);
        if (local_230 != &local_220) {
          operator_delete(local_230);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != &local_340.field_2) {
          operator_delete(local_340._M_dataplus._M_p);
        }
        if (local_300 != &local_2f0) {
          operator_delete(local_300);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p);
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != 100);
    std::__cxx11::string::pop_back();
    std::__cxx11::string::append((char *)&local_298);
    std::operator+(&local_250,"\\COPY ",&__rhs->_name);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_250);
    local_278 = &local_268;
    plVar10 = plVar5 + 2;
    if ((long *)*plVar5 == plVar10) {
      local_268 = *plVar10;
      lStack_260 = plVar5[3];
    }
    else {
      local_268 = *plVar10;
      local_278 = (long *)*plVar5;
    }
    local_270 = plVar5[1];
    *plVar5 = (long)plVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_278,multifaq::dir::PATH_TO_DATA_abi_cxx11_);
    plVar10 = plVar5 + 2;
    if ((long *)*plVar5 == plVar10) {
      local_2a8 = *plVar10;
      lStack_2a0 = plVar5[3];
      local_2b8 = &local_2a8;
    }
    else {
      local_2a8 = *plVar10;
      local_2b8 = (long *)*plVar5;
    }
    local_2b0 = plVar5[1];
    *plVar5 = (long)plVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b8);
    local_300 = &local_2f0;
    plVar10 = plVar5 + 2;
    if ((long *)*plVar5 == plVar10) {
      local_2f0 = *plVar10;
      lStack_2e8 = plVar5[3];
    }
    else {
      local_2f0 = *plVar10;
      local_300 = (long *)*plVar5;
    }
    local_2f8 = plVar5[1];
    *plVar5 = (long)plVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_300,(ulong)(__rhs->_name)._M_dataplus._M_p);
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    puVar11 = (ulong *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_320.field_2._M_allocated_capacity = *puVar11;
      local_320.field_2._8_8_ = plVar5[3];
    }
    else {
      local_320.field_2._M_allocated_capacity = *puVar11;
      local_320._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_320._M_string_length = plVar5[1];
    *plVar5 = (long)puVar11;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_320);
    psVar12 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_340.field_2._M_allocated_capacity = *psVar12;
      local_340.field_2._8_8_ = puVar9[3];
      local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    }
    else {
      local_340.field_2._M_allocated_capacity = *psVar12;
      local_340._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_340._M_string_length = puVar9[1];
    *puVar9 = psVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_340);
    plVar5 = puVar9 + 2;
    if ((long *)*puVar9 == plVar5) {
      local_220 = *plVar5;
      lStack_218 = puVar9[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *plVar5;
      local_230 = (long *)*puVar9;
    }
    local_228 = puVar9[1];
    *puVar9 = plVar5;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_298,(ulong)local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p);
    }
    if (local_300 != &local_2f0) {
      operator_delete(local_300);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8);
    }
    uVar14 = local_258;
    if (local_278 != &local_268) {
      operator_delete(local_278);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    uVar14 = uVar14 + 1;
  }
  local_340._M_dataplus._M_p = (pointer)paVar16;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_340,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
             DAT_002d84a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_340);
  std::ofstream::ofstream(&local_230,(string *)&local_340,_S_out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != paVar16) {
    operator_delete(local_340._M_dataplus._M_p);
  }
  std::operator+(&local_340,&local_2e0,&local_298);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,local_340._M_dataplus._M_p,local_340._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != paVar16) {
    operator_delete(local_340._M_dataplus._M_p);
  }
  std::ofstream::close();
  local_340._M_dataplus._M_p = (pointer)paVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"");
  uVar14 = 0;
  do {
    sVar4 = QueryCompiler::numberOfViews
                      ((local_2c0->_qc).
                       super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (sVar4 <= uVar14) {
      paVar16 = &local_320.field_2;
      local_320._M_dataplus._M_p = (pointer)paVar16;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_320,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
                 DAT_002d84a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
      std::__cxx11::string::append((char *)&local_320);
      std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_320);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != paVar16) {
        operator_delete(local_320._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,local_340._M_dataplus._M_p,local_340._M_string_length);
      std::ofstream::close();
      local_320._M_dataplus._M_p = (pointer)paVar16;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_320,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
                 DAT_002d84a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
      std::__cxx11::string::append((char *)&local_320);
      std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_320);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != paVar16) {
        operator_delete(local_320._M_dataplus._M_p);
      }
      std::operator+(&local_320,&local_2e0,&local_340);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,local_320._M_dataplus._M_p,local_320._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != paVar16) {
        operator_delete(local_320._M_dataplus._M_p);
      }
      std::ofstream::close();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p);
      }
      local_230 = _VTT;
      *(undefined8 *)((long)&local_230 + _VTT[-3]) = _error_with_option_name;
      std::filebuf::~filebuf((filebuf *)&local_228);
      std::ios_base::~ios_base(local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p);
      }
      return;
    }
    cVar15 = '\x01';
    if (9 < uVar14) {
      uVar13 = uVar14;
      cVar3 = '\x04';
      do {
        cVar15 = cVar3;
        if (uVar13 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_002956f4;
        }
        if (uVar13 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_002956f4;
        }
        if (uVar13 < 10000) goto LAB_002956f4;
        bVar2 = 99999 < uVar13;
        uVar13 = uVar13 / 10000;
        cVar3 = cVar15 + '\x04';
      } while (bVar2);
      cVar15 = cVar15 + '\x01';
    }
LAB_002956f4:
    local_2b8 = &local_2a8;
    std::__cxx11::string::_M_construct((ulong)&local_2b8,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2b8,(uint)local_2b0,uVar14);
    puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,0x2b1c1a);
    local_300 = &local_2f0;
    plVar5 = puVar9 + 2;
    if ((long *)*puVar9 == plVar5) {
      local_2f0 = *plVar5;
      lStack_2e8 = puVar9[3];
    }
    else {
      local_2f0 = *plVar5;
      local_300 = (long *)*puVar9;
    }
    local_2f8 = puVar9[1];
    *puVar9 = plVar5;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_300);
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    puVar11 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_320.field_2._M_allocated_capacity = *puVar11;
      local_320.field_2._8_8_ = puVar9[3];
    }
    else {
      local_320.field_2._M_allocated_capacity = *puVar11;
      local_320._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_320._M_string_length = puVar9[1];
    *puVar9 = puVar11;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_340,(ulong)local_320._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p);
    }
    if (local_300 != &local_2f0) {
      operator_delete(local_300);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8);
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

void SqlGenerator::generateLoadQuery()
{
    string load = "", drop = "";
    
    for (size_t relID = 0; relID < _td->numberOfRelations(); ++relID)
    {
        TDNode* rel = _td->getRelation(relID);
        const std::string& relName = rel->_name;

        drop += "DROP TABLE IF EXISTS "+relName+";\n";
        
        load += "CREATE TABLE "+relName+ "(";
        for (size_t var = 0; var < NUM_OF_VARIABLES; var++)
        {
            if (rel->_bag[var])
            {
                Attribute* att = _td->getAttribute(var);
                load += att->_name+" "+typeToStr(att->_type)+",";
            }
        }
        load.pop_back();
        load += ");\n";

        load += "\\COPY "+relName+" FROM \'"+multifaq::dir::PATH_TO_DATA+"/"+relName+".tbl\' "+
                "DELIMITER \'|\' CSV;\n";
    }

    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"/load_data.sql", std::ofstream::out);
    ofs << drop + load;
    ofs.close();
    // DINFO(drop + load);

    string drop_views = "";

    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
        drop_views +=  "DROP TABLE IF EXISTS view_"+std::to_string(viewID)+";\n";

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"/lmfao_cleanup.sql", std::ofstream::out);
    ofs << drop_views;
    ofs.close();
    
    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"/drop_data.sql", std::ofstream::out);
    ofs << drop + drop_views;
    ofs.close();
}